

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O3

int32_t anon_unknown.dwarf_31142e::getStringArray
                  (ResourceData *pResData,ResourceArray *array,UnicodeString *dest,int32_t capacity,
                  UErrorCode *errorCode)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Resource res;
  ulong uVar4;
  int32_t sLength;
  ConstChar16Ptr local_50;
  int32_t local_44;
  UChar *local_40;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  if (dest == (UnicodeString *)0x0) {
    if (capacity != 0) goto LAB_002d1607;
  }
  else if (capacity < 0) {
LAB_002d1607:
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  uVar1 = array->length;
  uVar3 = 0;
  if ((ulong)uVar1 != 0) {
    uVar3 = uVar1;
    if (capacity < (int)uVar1) {
      *errorCode = U_BUFFER_OVERFLOW_ERROR;
    }
    else if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        if (array->items16 == (uint16_t *)0x0) {
          res = array->items32[uVar4];
        }
        else {
          uVar2 = (uint)array->items16[uVar4];
          if (pResData->poolStringIndex16Limit <= (int)uVar2) {
            uVar2 = (uVar2 - pResData->poolStringIndex16Limit) + pResData->poolStringIndexLimit;
          }
          res = uVar2 | 0x60000000;
        }
        local_50.p_ = res_getString_63(pResData,res,&local_44);
        if (local_50.p_ == (UChar *)0x0) {
          *errorCode = U_RESOURCE_TYPE_MISMATCH;
          return 0;
        }
        icu_63::UnicodeString::setTo(dest,'\x01',&local_50,local_44);
        local_40 = local_50.p_;
        uVar4 = uVar4 + 1;
        dest = dest + 1;
      } while (uVar1 != uVar4);
    }
  }
  return uVar3;
}

Assistant:

int32_t getStringArray(const ResourceData *pResData, const icu::ResourceArray &array,
                       icu::UnicodeString *dest, int32_t capacity,
                       UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    if(dest == NULL ? capacity != 0 : capacity < 0) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    int32_t length = array.getSize();
    if(length == 0) {
        return 0;
    }
    if(length > capacity) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return length;
    }
    for(int32_t i = 0; i < length; ++i) {
        int32_t sLength;
        const UChar *s = res_getString(pResData, array.internalGetResource(pResData, i), &sLength);
        if(s == NULL) {
            errorCode = U_RESOURCE_TYPE_MISMATCH;
            return 0;
        }
        dest[i].setTo(TRUE, s, sLength);
    }
    return length;
}